

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

void __thiscall MemoryFootprintAllocator::fastFree(MemoryFootprintAllocator *this,void *ptr)

{
  _Base_ptr p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  iterator __position;
  void *local_28;
  
  local_28 = ptr;
  pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  pmVar2 = std::
           map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           ::operator[](&this->bookkeeper,&local_28);
  this->current_memory_usage = this->current_memory_usage - (int)*pmVar2;
  __position._M_node = &(this->bookkeeper)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = __position._M_node;
  for (p_Var1 = (this->bookkeeper)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(void **)(p_Var1 + 1) < local_28]) {
    if (*(void **)(p_Var1 + 1) >= local_28) {
      p_Var3 = p_Var1;
    }
  }
  if ((p_Var3 != __position._M_node) && (*(void **)(p_Var3 + 1) <= local_28)) {
    __position._M_node = p_Var3;
  }
  std::
  _Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                      *)&this->bookkeeper,__position);
  if (local_28 != (void *)0x0) {
    free(local_28);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

virtual void fastFree(void* ptr)
    {
        ncnn::MutexLockGuard g(lock);
        size_t size = bookkeeper[ptr];
        current_memory_usage -= size;
        bookkeeper.erase(bookkeeper.find(ptr));
        ncnn::fastFree(ptr);
    }